

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O1

void __thiscall PRED<UFPC>::FirstScan(PRED<UFPC> *this)

{
  long lVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  Mat1i *pMVar5;
  Mat1b *pMVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  char *pcVar21;
  long lVar22;
  uint *puVar23;
  int iVar24;
  uint *puVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar17 = 0;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  puVar23 = UFPC::P_;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar26 = *(int *)&pMVar6->field_0xc;
  lVar27 = (long)iVar26;
  uVar4 = *(uint *)&pMVar6->field_0x8;
  if (0 < lVar27) {
    lVar29 = *(long *)&pMVar6->field_0x10;
    lVar7 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    do {
      iVar24 = (int)uVar17;
      if (*(char *)(lVar29 + iVar24) != '\0') {
        puVar23[UFPC::length_] = UFPC::length_;
        uVar11 = UFPC::length_ + 1;
        *(uint *)(lVar7 + (long)iVar24 * 4) = UFPC::length_;
        UFPC::length_ = uVar11;
        if (iVar26 <= iVar24 + 1) break;
        uVar17 = (ulong)(iVar24 + 1);
        while (*(char *)(lVar29 + uVar17) != '\0') {
          *(undefined4 *)(lVar7 + uVar17 * 4) =
               *(undefined4 *)(lVar7 + (long)((int)uVar17 + -1) * 4);
          uVar17 = uVar17 + 1;
          if (iVar26 == (int)uVar17) goto LAB_0019b26b;
        }
      }
      uVar11 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar11;
    } while ((int)uVar11 < iVar26);
  }
LAB_0019b26b:
  if (1 < (int)uVar4) {
    uVar17 = 1;
    lVar29 = 0;
    do {
      pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar14 = *(long *)&pMVar6->field_0x10;
      lVar8 = **(long **)&pMVar6->field_0x48;
      lVar28 = lVar8 * uVar17;
      lVar7 = lVar14 + lVar28;
      pcVar21 = (char *)(lVar7 - lVar8);
      lVar9 = *(long *)&pMVar5->field_0x10;
      lVar10 = **(long **)&pMVar5->field_0x48;
      lVar12 = lVar10 * uVar17;
      puVar23 = (uint *)(lVar9 + lVar12);
      puVar25 = (uint *)((long)puVar23 - lVar10);
      iVar26 = (int)(lVar27 + -1);
      if (iVar26 == 0) {
        if (*(char *)(lVar14 + lVar28) != '\0') {
          if (*pcVar21 == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar11 = UFPC::length_ + 1;
            *puVar23 = UFPC::length_;
            UFPC::length_ = uVar11;
          }
          else {
            *puVar23 = *puVar25;
          }
        }
      }
      else {
        if (*(char *)(lVar14 + lVar28) == '\0') {
          uVar18 = 0;
          goto LAB_0019b39a;
        }
        if (*pcVar21 == '\0') {
          if (pcVar21[1] == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar11 = UFPC::length_ + 1;
            *puVar23 = UFPC::length_;
            UFPC::length_ = uVar11;
            iVar24 = 0;
            goto LAB_0019b56b;
          }
          *puVar23 = puVar25[1];
          iVar24 = 0;
          goto LAB_0019b6c9;
        }
        *puVar23 = *puVar25;
        uVar18 = 0;
LAB_0019b6f2:
        iVar24 = (int)uVar18;
        iVar16 = iVar24 + 1;
        if (iVar16 < iVar26) {
          lVar22 = (long)iVar24;
          lVar13 = lVar12 + lVar22 * 4;
          lVar20 = 0;
          while( true ) {
            iVar16 = (int)(lVar22 + 1);
            if (*(char *)(lVar28 + lVar22 + lVar14 + 1 + lVar20) == '\0') {
              uVar11 = iVar16 + (int)lVar20;
              goto LAB_0019b806;
            }
            if (*(char *)(lVar8 * lVar29 + lVar22 + lVar14 + 1 + lVar20) == '\0') break;
            *(undefined4 *)(lVar9 + 4 + lVar13 + lVar20 * 4) =
                 *(undefined4 *)(lVar10 * lVar29 + lVar22 * 4 + lVar9 + 4 + lVar20 * 4);
            lVar20 = lVar20 + 1;
            if (lVar22 + (1 - lVar27) + 1 + lVar20 == 0) {
              iVar24 = iVar24 + (int)lVar20;
              iVar16 = iVar16 + (int)lVar20;
              goto LAB_0019b7b1;
            }
          }
          uVar18 = lVar22 + 1 + lVar20;
          iVar24 = iVar24 + (int)lVar20;
          iVar16 = iVar24 + 2;
          if (pcVar21[iVar16] == '\0') {
            *(uint *)(lVar13 + lVar9 + 4 + lVar20 * 4) = puVar23[iVar24];
            iVar24 = (int)uVar18;
            goto LAB_0019b56b;
          }
          uVar11 = UFPC::Merge(puVar23[iVar24],puVar25[iVar16]);
          *(uint *)(lVar13 + lVar9 + 4 + lVar20 * 4) = uVar11;
LAB_0019b6c0:
          do {
            iVar24 = (int)uVar18;
LAB_0019b6c9:
            lVar13 = (long)iVar24;
            uVar18 = lVar13 + 1;
            cVar3 = *(char *)(lVar7 + 1 + lVar13);
            if (iVar26 <= (int)uVar18) {
              if (cVar3 != '\0') {
                puVar23[lVar13 + 1] = puVar25[lVar13 + 1];
              }
              goto LAB_0019b885;
            }
            if (cVar3 != '\0') {
              puVar23[lVar13 + 1] = puVar25[lVar13 + 1];
              goto LAB_0019b6f2;
            }
LAB_0019b39a:
            while( true ) {
              lVar22 = (long)(int)uVar18;
              lVar13 = lVar22 << 0x20;
              lVar20 = 0;
              do {
                lVar15 = lVar13;
                lVar19 = lVar15 >> 0x20;
                if (lVar27 + -1 <= lVar22 + lVar20 + 1) {
                  lVar14 = lVar15 + 0x100000000 >> 0x20;
                  if (*(char *)(lVar7 + lVar14) == '\0') goto LAB_0019b885;
                  if (pcVar21[lVar14] == '\0') {
                    if (pcVar21[lVar19] == '\0') {
                      UFPC::P_[UFPC::length_] = UFPC::length_;
                      uVar11 = UFPC::length_ + 1;
                      puVar23[lVar14] = UFPC::length_;
                      UFPC::length_ = uVar11;
                      goto LAB_0019b885;
                    }
                    uVar11 = puVar25[lVar19];
                  }
                  else {
                    uVar11 = puVar25[lVar14];
                  }
                  puVar23[lVar14] = uVar11;
                  goto LAB_0019b885;
                }
                lVar1 = lVar20 + 1;
                pcVar2 = (char *)(lVar22 + lVar28 + lVar14 + 1 + lVar20);
                lVar13 = lVar15 + 0x100000000;
                lVar20 = lVar1;
              } while (*pcVar2 == '\0');
              uVar18 = (uVar18 & 0xffffffff) + lVar1;
              iVar24 = (int)uVar18;
              if (*(char *)(lVar1 + lVar8 * lVar29 + lVar22 + lVar14) != '\0') {
                *(undefined4 *)(lVar12 + lVar22 * 4 + lVar9 + lVar1 * 4) =
                     *(undefined4 *)(lVar10 * lVar29 + lVar22 * 4 + lVar9 + lVar1 * 4);
                goto LAB_0019b6f2;
              }
              lVar13 = lVar15 + 0x200000000 >> 0x20;
              if (pcVar21[lVar13] != '\0') break;
              if (pcVar21[lVar19] == '\0') {
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar11 = UFPC::length_ + 1;
                *(uint *)(lVar12 + lVar22 * 4 + lVar9 + lVar1 * 4) = UFPC::length_;
                UFPC::length_ = uVar11;
              }
              else {
                *(uint *)(lVar12 + lVar22 * 4 + lVar9 + lVar1 * 4) = puVar25[lVar19];
              }
LAB_0019b56b:
              iVar16 = iVar24 + 1;
              if (iVar26 <= iVar16) {
LAB_0019b628:
                lVar14 = (long)iVar16;
                if (*(char *)(lVar7 + lVar14) != '\0') goto LAB_0019b87d;
                goto LAB_0019b885;
              }
              lVar20 = (long)iVar24;
              iVar16 = iVar24 + 1;
              lVar22 = lVar20 << 0x20;
              lVar13 = lVar12 + lVar20 * 4;
              lVar15 = lVar9 + lVar13;
              lVar19 = 0;
              while (*(char *)(lVar28 + lVar20 + lVar14 + 1 + lVar19) != '\0') {
                if (*(char *)(lVar8 * lVar29 + lVar20 + lVar14 + 2 + lVar19) != '\0') {
                  uVar18 = (ulong)(uint)(iVar16 + (int)lVar19);
                  uVar11 = UFPC::Merge(*(uint *)((long)puVar23 + (lVar22 >> 0x1e)),
                                       *(uint *)(lVar10 * lVar29 + lVar20 * 4 + lVar9 + 8 +
                                                lVar19 * 4));
                  *(uint *)(lVar13 + lVar9 + 4 + lVar19 * 4) = uVar11;
                  goto LAB_0019b6c0;
                }
                *(undefined4 *)(lVar15 + 4 + lVar19 * 4) = *(undefined4 *)(lVar15 + lVar19 * 4);
                lVar22 = lVar22 + 0x100000000;
                lVar19 = lVar19 + 1;
                if ((1 - lVar27) + lVar20 + 1 + lVar19 == 0) {
                  iVar24 = iVar24 + (int)lVar19;
                  iVar16 = iVar16 + (int)lVar19;
                  goto LAB_0019b628;
                }
              }
              uVar11 = iVar16 + (int)lVar19;
LAB_0019b806:
              uVar18 = (ulong)uVar11;
            }
            if (pcVar21[lVar19] == '\0') {
              uVar11 = puVar25[lVar13];
            }
            else {
              uVar11 = UFPC::Merge(puVar25[lVar19],puVar25[lVar13]);
            }
            *(uint *)(lVar12 + lVar22 * 4 + lVar9 + lVar1 * 4) = uVar11;
          } while( true );
        }
LAB_0019b7b1:
        lVar14 = (long)iVar16;
        if (*(char *)(lVar7 + lVar14) != '\0') {
          if (pcVar21[lVar14] == '\0') {
LAB_0019b87d:
            uVar11 = puVar23[iVar24];
          }
          else {
            uVar11 = puVar25[lVar14];
          }
          puVar23[lVar14] = uVar11;
        }
      }
LAB_0019b885:
      uVar17 = uVar17 + 1;
      lVar29 = lVar29 + 1;
    } while (uVar17 != uVar4);
  }
  return;
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"
                
        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
        
#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
    }